

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void pbrt::PlyErrorCallback(p_ply param_1,char *message)

{
  string ret;
  string local_38;
  char *local_18;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_18 = message;
  detail::stringPrintfRecursive<char_const*&>(&local_38,"PLY writing error: %s",&local_18);
  Error((FileLoc *)0x0,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void PlyErrorCallback(p_ply, const char *message) {
    Error("PLY writing error: %s", message);
}